

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

string * translateOperatorNames(string *__return_storage_ptr__,string *s,int characteristic)

{
  allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *paVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l_02;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a20;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_928;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_848;
  int local_81c;
  undefined1 local_818 [4];
  int i_2;
  int local_7f4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7f0;
  undefined1 local_7ef;
  allocator local_7ee;
  allocator local_7ed;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  iterator local_720;
  size_type local_718;
  undefined1 local_710 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  estrs;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_6f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_6d0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_6b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_690;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_670;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_650;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_630;
  size_type local_628;
  undefined1 local_620 [8];
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ereps;
  regex e6;
  regex e5;
  regex e4;
  regex e3;
  regex e2;
  regex e1;
  int local_524;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_51e;
  undefined1 local_51d;
  int i;
  allocator local_518;
  allocator local_517;
  allocator local_516;
  allocator local_515;
  allocator local_514;
  allocator local_513;
  allocator local_512;
  allocator local_511;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  iterator local_388;
  size_type local_380;
  undefined1 local_378 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mstrs;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_358;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_338;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_318;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2f8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2d8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_2b8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_298;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_278;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_238;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_218;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1f8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  mreps;
  regex m12;
  regex m11;
  regex m10;
  regex m9;
  regex m8;
  regex m7;
  regex m6;
  regex m5;
  regex m4;
  regex m3;
  undefined1 local_60 [8];
  regex m2;
  regex m1;
  int characteristic_local;
  string *s_local;
  string *result;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bMAX )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,"(\\bmax )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bMAX\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bmax\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bMIN )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m7._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bmin )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m8._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bMIN\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m9._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bmin\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m10._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bNOT )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m11._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bnot )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m12._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bNOT\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &mreps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"(\\bnot\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_358,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_338,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_318,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2f8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2d8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_2b8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m7._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_298,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m8._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_278,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m9._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_258,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m10._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_238,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m11._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_218,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m12._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_1f8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &mreps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1d0 = 0xc;
  paVar1 = (allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
           ((long)&mstrs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_1d8 = &local_358;
  std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::allocator
            (paVar1);
  __l_02._M_len = local_1d0;
  __l_02._M_array = (iterator)local_1d8;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
            *)local_1c8,__l_02,paVar1);
  std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::~allocator
            ((allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
             ((long)&mstrs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_848 = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1d8;
  do {
    local_848 = local_848 + -1;
    Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (local_848);
  } while (local_848 != &local_358);
  local_51d = 1;
  local_510 = &local_508;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,">",&local_511);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,">",&local_512);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,">(",&local_513);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,">(",&local_514);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"<",&local_515);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"<",&local_516);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"<(",&local_517);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"<(",&local_518);
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"~",(allocator *)((long)&i + 3));
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"~",(allocator *)((long)&i + 2));
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"~(",(allocator *)((long)&i + 1));
  local_510 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"~(",(allocator *)&i);
  local_51d = 0;
  local_388 = &local_508;
  local_380 = 0xc;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_51e);
  __l_01._M_len = local_380;
  __l_01._M_array = local_388;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_378,__l_01,&local_51e);
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_51e);
  local_928 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388;
  do {
    local_928 = local_928 + -1;
    std::__cxx11::string::~string((string *)local_928);
  } while (local_928 != &local_508);
  std::allocator<char>::~allocator((allocator<char> *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_517);
  std::allocator<char>::~allocator((allocator<char> *)&local_516);
  std::allocator<char>::~allocator((allocator<char> *)&local_515);
  std::allocator<char>::~allocator((allocator<char> *)&local_514);
  std::allocator<char>::~allocator((allocator<char> *)&local_513);
  std::allocator<char>::~allocator((allocator<char> *)&local_512);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  for (local_524 = 0;
      sVar3 = std::
              vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ::size((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                      *)local_1c8), (ulong)(long)local_524 < sVar3; local_524 = local_524 + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                           *)local_1c8,(long)local_524);
    pvVar5 = Catch::clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_378,(long)local_524);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &e1._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,__return_storage_ptr__,pvVar4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar5,0);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)
               &e1._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &e1._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bAND) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e3._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\band) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(\\bXOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &ereps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"(\\bxor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_6f0,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_6d0,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e3._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_6b0,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_690,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_670,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_650,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &ereps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_628 = 6;
  paVar1 = (allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
           ((long)&estrs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_630 = &local_6f0;
  std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::allocator
            (paVar1);
  __l_00._M_len = local_628;
  __l_00._M_array = (iterator)local_630;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
            *)local_620,__l_00,paVar1);
  std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>::~allocator
            ((allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> *)
             ((long)&estrs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_9a0 = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_630;
  do {
    local_9a0 = local_9a0 + -1;
    Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              (local_9a0);
  } while (local_9a0 != &local_6f0);
  local_7ef = 1;
  local_7e8 = &local_7e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"*",(allocator *)((long)&i_1 + 3));
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"*",(allocator *)((long)&i_1 + 2));
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,"|",(allocator *)((long)&i_1 + 1));
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_780,"|",(allocator *)&i_1);
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"+",&local_7ed);
  local_7e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"+",&local_7ee);
  local_7ef = 0;
  local_720 = &local_7e0;
  local_718 = 6;
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_7f0);
  __l._M_len = local_718;
  __l._M_array = local_720;
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_710,__l,&local_7f0);
  Catch::clara::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_7f0);
  local_a20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_720;
  do {
    local_a20 = local_a20 + -1;
    std::__cxx11::string::~string((string *)local_a20);
  } while (local_a20 != &local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7ee);
  std::allocator<char>::~allocator((allocator<char> *)&local_7ed);
  std::allocator<char>::~allocator((allocator<char> *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  if (characteristic == 2) {
    for (local_7f4 = 0; uVar6 = (ulong)local_7f4,
        sVar3 = std::
                vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                ::size((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                        *)local_620), uVar6 < sVar3; local_7f4 = local_7f4 + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                             *)local_620,(long)local_7f4);
      pvVar5 = Catch::clara::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_710,(long)local_7f4);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818,
                 __return_storage_ptr__,pvVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar5,0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_818);
      std::__cxx11::string::~string((string *)local_818);
    }
  }
  else {
    for (local_81c = 0;
        sVar3 = std::
                vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                ::size((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                        *)local_620), (ulong)(long)local_81c < sVar3; local_81c = local_81c + 1) {
      pvVar4 = std::
               vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                             *)local_620,(long)local_81c);
      bVar2 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (__return_storage_ptr__,pvVar4,0);
      if (bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"characteristic 2 needed for AND/OR/XOR");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_710);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
             *)local_620);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &ereps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e3._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &e2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_378);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
             *)local_1c8);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &mreps.
              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m12._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m11._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m10._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m9._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m8._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m7._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m6._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m5._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m4._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  Catch::clara::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &m2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string translateOperatorNames(const std::string& s, int characteristic)
{
  // TODO (created 19 Jan 2021: this doesn't handle A or(A and B) (paren after or, and, xor).
  // fix this.  Can this code be simplified?
  // possibly change to a translate(string, word, replacement word) (perhaps no regex here?)

  // Oct 12, 2021: Not allowing AND/OR is characteristic != 2, but this isn't where it will fail.
  std::regex m1 ("(\\bMAX )");
  std::regex m2 ("(\\bmax )");
  std::regex m3 ("(\\bMAX\\()");
  std::regex m4 ("(\\bmax\\()");

  std::regex m5 ("(\\bMIN )");
  std::regex m6 ("(\\bmin )");
  std::regex m7 ("(\\bMIN\\()");
  std::regex m8 ("(\\bmin\\()");

  std::regex m9 ("(\\bNOT )");
  std::regex m10 ("(\\bnot )");
  std::regex m11 ("(\\bNOT\\()");
  std::regex m12 ("(\\bnot\\()");

  std::vector<std::regex> mreps =  { m1,  m2,   m3,   m4,  m5,  m6,   m7,   m8,  m9, m10,  m11,  m12};
  std::vector<std::string> mstrs = {">", ">", ">(", ">(", "<", "<", "<(", "<(", "~", "~", "~(", "~("};

  auto result = s;
  for (int i = 0; i < mreps.size(); ++i)
    {
      result = std::regex_replace(result, mreps[i], mstrs[i]);
    }
  
  std::regex e1 ("(\\bAND) +");
  std::regex e2 ("(\\band) +");
  std::regex e3 ("(\\bOR +)");
  std::regex e4 ("(\\bor +)");
  std::regex e5 ("(\\bXOR +)");
  std::regex e6 ("(\\bxor +)");

  std::vector<std::regex> ereps =  {  e1,  e2,  e3,  e4,  e5,  e6};
  std::vector<std::string> estrs = { "*", "*", "|", "|", "+", "+"};

  // if char=2 search and replace, if char!=2 search and error
  if (characteristic == 2)
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          result = std::regex_replace(result, ereps[i], estrs[i]);
        }
    }
  else
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          if(std::regex_search(result, ereps[i]))
            throw std::runtime_error("characteristic 2 needed for AND/OR/XOR");
        }
    }
  
  return result;
}